

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::GetRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  CppType CVar2;
  MessageLite *pMVar3;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar4;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    pMVar3 = internal::ExtensionSet::GetRepeatedMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),
                        index);
    return (Message *)pMVar3;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
    pRVar4 = internal::MapFieldBase::GetRepeatedField(this_00);
  }
  else {
    pRVar4 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
  }
  return (Message *)pRVar4->rep_->elements[index];
}

Assistant:

const Message& Reflection::GetRepeatedMessage(const Message& message,
                                              const FieldDescriptor* field,
                                              int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    if (IsMapFieldInApi(field)) {
      return GetRaw<MapFieldBase>(message, field)
          .GetRepeatedField()
          .Get<GenericTypeHandler<Message> >(index);
    } else {
      return GetRaw<RepeatedPtrFieldBase>(message, field)
          .Get<GenericTypeHandler<Message> >(index);
    }
  }
}